

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  ~IfcOccupant((IfcOccupant *)
               (&(this->super_IfcActor).super_IfcObject.field_0x0 +
               *(long *)(*(long *)&(this->super_IfcActor).super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}